

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O0

int32_t icu_63::anon_unknown_9::binarySearch(int64_t *list,int32_t limit,int64_t ce)

{
  int iVar1;
  int32_t iVar2;
  int32_t cmp;
  int32_t i;
  int32_t start;
  int64_t ce_local;
  int32_t limit_local;
  int64_t *list_local;
  
  if (limit == 0) {
    list_local._4_4_ = 0xffffffff;
  }
  else {
    cmp = 0;
    iVar2 = cmp;
    ce_local._4_4_ = limit;
    do {
      while( true ) {
        cmp = iVar2;
        iVar1 = (cmp + ce_local._4_4_) / 2;
        iVar2 = compareInt64AsUnsigned(ce,list[iVar1]);
        if (iVar2 == 0) {
          return iVar1;
        }
        if (-1 < iVar2) break;
        iVar2 = cmp;
        ce_local._4_4_ = iVar1;
        if (iVar1 == cmp) {
          return cmp ^ 0xffffffff;
        }
      }
      iVar2 = iVar1;
    } while (iVar1 != cmp);
    list_local._4_4_ = cmp + 1U ^ 0xffffffff;
  }
  return list_local._4_4_;
}

Assistant:

int32_t
binarySearch(const int64_t list[], int32_t limit, int64_t ce) {
    if (limit == 0) { return ~0; }
    int32_t start = 0;
    for (;;) {
        int32_t i = (start + limit) / 2;
        int32_t cmp = compareInt64AsUnsigned(ce, list[i]);
        if (cmp == 0) {
            return i;
        } else if (cmp < 0) {
            if (i == start) {
                return ~start;  // insert ce before i
            }
            limit = i;
        } else {
            if (i == start) {
                return ~(start + 1);  // insert ce after i
            }
            start = i;
        }
    }
}